

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                     ImGuiWindowClass *window_class)

{
  byte *pbVar1;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  ImGuiWindow *this;
  ImGuiWindow *pIVar4;
  ImGuiColorMod *pIVar5;
  float fVar6;
  ImGuiContext *ctx;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiID IVar9;
  ImGuiContext *g_1;
  ImGuiDockNode *this_00;
  long lVar10;
  ImGuiContext *g;
  uint uVar11;
  ImGuiDockNode *node;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  int iVar15;
  char title [256];
  undefined1 local_138 [16];
  bool local_128;
  
  ctx = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    uVar11 = (uint)this->SkipItems | flags;
    this_00 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&ctx->DockContext->Nodes,id);
    if (this_00 == (ImGuiDockNode *)0x0) {
      this_00 = DockContextAddNode(ctx,id);
      pbVar1 = (byte *)((long)&this_00->LocalFlags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    this_00->SharedFlags = uVar11;
    if (window_class == (ImGuiWindowClass *)0x0) {
      local_138._0_4_ = 0;
      local_138._4_4_ = 0;
      local_138._8_8_ = 0;
      local_128 = false;
      bVar8 = true;
    }
    else {
      local_128 = window_class->DockingAlwaysTabBar;
      local_138._0_4_ = window_class->ClassId;
      local_138._4_4_ = window_class->ParentViewportId;
      local_138._8_4_ = window_class->ViewportFlagsOverrideSet;
      local_138._12_4_ = window_class->ViewportFlagsOverrideClear;
      bVar8 = window_class->DockingAllowUnclassed;
    }
    (this_00->WindowClass).DockingAlwaysTabBar = local_128;
    (this_00->WindowClass).ClassId = local_138._0_4_;
    (this_00->WindowClass).ParentViewportId = local_138._4_4_;
    (this_00->WindowClass).ViewportFlagsOverrideSet = local_138._8_4_;
    (this_00->WindowClass).ViewportFlagsOverrideClear = local_138._12_4_;
    (this_00->WindowClass).DockingAllowUnclassed = bVar8;
    iVar15 = ctx->FrameCount;
    this_00->LocalFlags = this_00->LocalFlags | 0x400;
    pIVar7 = GImGui;
    if ((this_00->LastFrameActive != iVar15) || ((uVar11 & 1) != 0)) {
      if ((uVar11 & 1) == 0) {
        pIVar4 = GImGui->CurrentWindow;
        IVar14 = (pIVar4->ContentRegionRect).Max;
        if ((pIVar4->DC).CurrentColumns != (ImGuiColumns *)0x0) {
          IVar14.x = (pIVar4->WorkRect).Max.x;
        }
        iVar15 = (int)(*size_arg).x;
        fVar12 = (float)iVar15;
        fVar13 = (float)(int)(*size_arg).y;
        if ((iVar15 < 1) && (fVar12 = (IVar14.x - (pIVar4->DC).CursorPos.x) + fVar12, fVar12 <= 4.0)
           ) {
          fVar12 = 4.0;
        }
        if ((fVar13 <= 0.0) &&
           (fVar13 = fVar13 + (IVar14.y - (pIVar4->DC).CursorPos.y), fVar13 <= 4.0)) {
          fVar13 = 4.0;
        }
        this_00->Pos = (this->DC).CursorPos;
        (this_00->Size).x = fVar12;
        (this_00->Size).y = fVar13;
        (this_00->SizeRef).x = fVar12;
        (this_00->SizeRef).y = fVar13;
        uVar11 = (pIVar7->NextWindowData).Flags;
        (pIVar7->NextWindowData).Flags = uVar11 | 1;
        (pIVar7->NextWindowData).PosVal = this_00->Pos;
        (pIVar7->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar7->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar7->NextWindowData).PosCond = 1;
        (pIVar7->NextWindowData).PosUndock = true;
        (pIVar7->NextWindowData).Flags = uVar11 | 3;
        (pIVar7->NextWindowData).SizeVal = this_00->Size;
        (pIVar7->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString(local_138,0x100,"%s/DockSpace_%08X",this->Name,id);
        if ((0 < (this_00->Windows).Size) || (this_00->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PushStyleColor(3,0);
        }
        PushStyleVar(7,0.0);
        Begin(local_138,(bool *)0x0,0x2100013b);
        PopStyleVar(1);
        pIVar7 = GImGui;
        if ((0 < (this_00->Windows).Size) || (this_00->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          lVar10 = (long)(GImGui->ColorModifiers).Size;
          pIVar5 = (GImGui->ColorModifiers).Data;
          pIVar2 = &pIVar5[lVar10 + -1].BackupValue;
          fVar12 = pIVar2->y;
          fVar13 = pIVar2->z;
          fVar6 = pIVar2->w;
          pIVar3 = (GImGui->Style).Colors + pIVar5[lVar10 + -1].Col;
          pIVar3->x = pIVar2->x;
          pIVar3->y = fVar12;
          pIVar3->z = fVar13;
          pIVar3->w = fVar6;
          (pIVar7->ColorModifiers).Size = (pIVar7->ColorModifiers).Size + -1;
        }
        pIVar4 = ctx->CurrentWindow;
        pIVar4->DockNodeAsHost = this_00;
        node = (ImGuiDockNode *)local_138;
        IVar9 = ImGuiWindow::GetID(this,(char *)node,(char *)0x0);
        pIVar4->ChildId = IVar9;
        this_00->HostWindow = pIVar4;
        this_00->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        DockNodeUpdate((ImGui *)this_00,node);
        ctx->WithinEndChild = true;
        End();
        ctx->WithinEndChild = false;
      }
      else {
        this_00->LastFrameAlive = iVar15;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;
        return;
    }
    node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK Why do we need a child window to host a dockspace, could we host it in the existing window?
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    if (node->Windows.Size > 0 || node->IsSplitNode())
        PushStyleColor(ImGuiCol_ChildBg, IM_COL32(0, 0, 0, 0));
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PopStyleColor();

    ImGuiWindow* host_window = g.CurrentWindow;
    host_window->DockNodeAsHost = node;
    host_window->ChildId = window->GetID(title);
    node->HostWindow = host_window;
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());
    DockNodeUpdate(node);

    g.WithinEndChild = true;
    End();
    g.WithinEndChild = false;
}